

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_perspective_projection
                 (mat4 *__return_storage_ptr__,float fov,float aspect,float near,float far)

{
  float fVar1;
  float d;
  float c;
  float b;
  float a;
  float denominator;
  float f;
  float far_local;
  float near_local;
  float aspect_local;
  float fov_local;
  
  fVar1 = tanf((fov * 0.017453292) / 2.0);
  mat4_create(__return_storage_ptr__,(1.0 / fVar1) / aspect,0.0,0.0,0.0,0.0,1.0 / fVar1,0.0,0.0,0.0,
              0.0,(far + near) / (near - far),(far * 2.0 * near) / (near - far),0.0,0.0,-1.0,0.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_perspective_projection(float fov, float aspect, float near, float far) {
    float f = 1.0f / tanf(fov * DEGREES_PER_RADIAN / 2.0f);
    float denominator = near - far;

    float a = f / aspect;
    float b = f;
    float c = (far + near) / denominator;
    float d = (2.0f * far * near) / denominator;

    return mat4_create(
            a, 0.0f, 0.0f, 0.0f,
            0.0f, b, 0.0f, 0.0f,
            0.0f, 0.0f, c, d,
            0.0f, 0.0f, -1.0f, 0.0f);
}